

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeGetCurrentMassMatrix(void *arkode_mem,SUNMatrix *M)

{
  long lVar1;
  int line;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x874;
LAB_00146af7:
    arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetCurrentMassMatrix",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,msgfmt);
  }
  else {
    if (*(int *)((long)arkode_mem + 0x200) == 0) {
      *M = (SUNMatrix)0x0;
    }
    else {
      lVar1 = (**(code **)((long)arkode_mem + 0x218))(arkode_mem);
      if (lVar1 == 0) {
        msgfmt = "Mass matrix solver memory is NULL.";
        iVar2 = -6;
        error_code = -6;
        line = 0x101d;
        goto LAB_00146af7;
      }
      *M = *(SUNMatrix *)(lVar1 + 0x10);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ARKodeGetCurrentMassMatrix(void* arkode_mem, SUNMatrix* M)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return NULL for incompatible steppers */
  if (!ark_mem->step_supports_massmatrix)
  {
    *M = NULL;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set output and return */
  *M = arkls_mem->M;
  return (ARKLS_SUCCESS);
}